

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

void __thiscall
ColumnSampler<double>::initialize<double>(ColumnSampler<double> *this,double *weights,size_t n_cols)

{
  double *pdVar1;
  value_type_conflict in_RAX;
  size_t sVar2;
  ulong uVar3;
  pointer pdVar4;
  size_t sVar5;
  pointer pdVar6;
  double dVar7;
  value_type_conflict local_18;
  
  this->n_cols = n_cols;
  local_18 = in_RAX;
  sVar2 = log2ceil(n_cols);
  this->tree_levels = sVar2;
  pdVar4 = (this->tree_weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar6 = (this->tree_weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar4 == pdVar6) {
    local_18 = 0.0;
    std::vector<double,_std::allocator<double>_>::resize
              (&this->tree_weights,1L << ((char)sVar2 + 1U & 0x3f),&local_18);
  }
  else {
    if ((long)pdVar6 - (long)pdVar4 >> 3 != 1L << ((char)sVar2 + 1U & 0x3f)) {
      std::vector<double,_std::allocator<double>_>::resize(&this->tree_weights,sVar2);
      pdVar4 = (this->tree_weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar6 = (this->tree_weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
    }
    for (; pdVar4 != pdVar6; pdVar4 = pdVar4 + 1) {
      *pdVar4 = 0.0;
    }
  }
  uVar3 = ~(-1L << ((byte)this->tree_levels & 0x3f));
  this->offset = uVar3;
  sVar2 = this->n_cols;
  pdVar4 = (this->tree_weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (sVar5 = 0; sVar2 != sVar5; sVar5 = sVar5 + 1) {
    dVar7 = weights[sVar5];
    if (dVar7 <= 0.0) {
      dVar7 = 0.0;
    }
    pdVar4[uVar3 + sVar5] = dVar7;
  }
  pdVar1 = (this->tree_weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar3 = ((long)(this->tree_weights).super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)pdVar1 >> 3) - 2;
      uVar3 != 0xffffffffffffffff; uVar3 = uVar3 - 1) {
    *(double *)((long)pdVar1 + (uVar3 & 0xfffffffffffffffe) * 4) =
         pdVar1[uVar3 + 1] + *(double *)((long)pdVar1 + (uVar3 & 0xfffffffffffffffe) * 4);
  }
  if (*pdVar1 <= 0.0) {
    drop_weights(this);
  }
  this->n_dropped = 0;
  return;
}

Assistant:

void ColumnSampler<ldouble_safe>::initialize(real_t weights[], size_t n_cols)
{
    this->n_cols = n_cols;
    this->tree_levels = log2ceil(n_cols);
    if (this->tree_weights.empty())
        this->tree_weights.resize(pow2(this->tree_levels + 1), 0);
    else {
        if (this->tree_weights.size() != pow2(this->tree_levels + 1))
            this->tree_weights.resize(this->tree_levels);
        std::fill(this->tree_weights.begin(), this->tree_weights.end(), 0.);
    }

    /* compute sums for the tree leaves at each node */
    this->offset = pow2(this->tree_levels) - 1;
    for (size_t ix = 0; ix < this->n_cols; ix++)
        this->tree_weights[ix + this->offset] = std::fmax(0., weights[ix]);
    for (size_t ix = this->tree_weights.size() - 1; ix > 0; ix--)
        this->tree_weights[ix_parent(ix)] += this->tree_weights[ix];

    /* if the weights are invalid, make it an unweighted sampler */
    if (unlikely(std::isnan(this->tree_weights[0]) || this->tree_weights[0] <= 0))
    {
        this->drop_weights();
    }

    this->n_dropped = 0;
}